

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O1

void write_symlist(wchar_t fd,curses_symdef_conflict *list,wchar_t len)

{
  size_t __n;
  long lVar1;
  char buf [256];
  char acStack_138 [264];
  
  if (L'\0' < len) {
    lVar1 = 0;
    do {
      sprintf(acStack_138,"%c\"%s\"\t%d\t%04x\n",
              (ulong)((uint)(*(char *)((long)list->unichar + lVar1 + 0x1a) == '\0') * 2 + 0x21),
              *(undefined8 *)((long)list->unichar + lVar1 + -0xc),
              (ulong)*(uint *)((long)list->unichar + lVar1 + -4),
              (ulong)*(uint *)((long)list->unichar + lVar1));
      __n = strlen(acStack_138);
      write(fd,acStack_138,__n);
      lVar1 = lVar1 + 0x28;
    } while ((ulong)(uint)len * 0x28 != lVar1);
  }
  return;
}

Assistant:

static void write_symlist(int fd, const struct curses_symdef *list, int len)
{
    char buf[BUFSZ];
    int i;
    
    for (i = 0; i < len; i++) {
	sprintf(buf, "%c\"%s\"\t%d\t%04x\n", list[i].custom ? '!' : '#',
		list[i].symname, list[i].color, list[i].unichar[0]);
	write(fd, buf, strlen(buf));
    }
}